

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O2

UVec4 __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::getCompareThreshold(RandomFragmentOpCase *this)

{
  RenderTarget *pRVar1;
  long in_RSI;
  Vector<unsigned_int,_4> *this_00;
  Vector<unsigned_int,_4> VVar2;
  UVec4 UVar3;
  PixelFormat format;
  Vector<unsigned_int,_4> local_70;
  Vector<unsigned_int,_4> local_60;
  Vector<unsigned_int,_4> local_50;
  Vector<unsigned_int,_4> local_40;
  Vector<unsigned_int,_4> local_30;
  
  pRVar1 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
  format.redBits = (pRVar1->m_pixelFormat).redBits;
  format.greenBits = (pRVar1->m_pixelFormat).greenBits;
  format.blueBits = (pRVar1->m_pixelFormat).blueBits;
  format.alphaBits = (pRVar1->m_pixelFormat).alphaBits;
  if ((((format.redBits == 8) && (format.greenBits == 8)) && (format.blueBits == 8)) &&
     ((format._8_8_ & 0xfffffff700000000) == 0)) {
    local_70.m_data[0] = (uint)tcu::PixelFormat::getColorThreshold(&format);
    tcu::RGBA::toIVec((RGBA *)&local_50);
    tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_40);
    this_00 = &local_60;
    tcu::Vector<unsigned_int,_4>::Vector(this_00,6);
  }
  else {
    tcu::PixelFormat::getColorThreshold(&format);
    tcu::RGBA::toIVec((RGBA *)&local_60);
    tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_50);
    tcu::Vector<unsigned_int,_4>::Vector(&local_70,5);
    tcu::operator*((tcu *)&local_40,&local_50,&local_70);
    this_00 = &local_30;
    tcu::Vector<unsigned_int,_4>::Vector(this_00,2);
  }
  VVar2 = tcu::operator+((tcu *)this,&local_40,this_00);
  UVar3.m_data._8_8_ = VVar2.m_data._8_8_;
  UVar3.m_data._0_8_ = this;
  return (UVec4)UVar3.m_data;
}

Assistant:

tcu::UVec4 RandomFragmentOpCase::getCompareThreshold (void) const
{
	tcu::PixelFormat format = m_context.getRenderTarget().getPixelFormat();

	if (format == tcu::PixelFormat(8, 8, 8, 8) || format == tcu::PixelFormat(8, 8, 8, 0))
		return format.getColorThreshold().toIVec().asUint() + tcu::UVec4(6); // Default threshold.
	else
		return format.getColorThreshold().toIVec().asUint()
			   * tcu::UVec4(5) + tcu::UVec4(2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; especially multiple blendings bring extra inaccuracy.
}